

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall UI::State::changeColorScheme(State *this,bool inc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  ImGuiStyle *pIVar23;
  ulong uVar24;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,inc) != 0) {
    this->colorScheme = this->colorScheme + ((int)(this->colorScheme + Dark) / 3) * -3 + Dark;
  }
  pIVar23 = ImGui::GetStyle();
  uVar24 = (ulong)this->colorScheme;
  if (uVar24 < 3) {
    fVar1 = *(float *)(&DAT_001661fc + uVar24 * 4);
    fVar2 = *(float *)(&DAT_00166208 + uVar24 * 4);
    fVar3 = *(float *)(&DAT_00166268 + uVar24 * 4);
    fVar4 = *(float *)(&DAT_00166268 + uVar24 * 4);
    fVar5 = *(float *)(&DAT_00166274 + uVar24 * 4);
    fVar6 = *(float *)(&DAT_00166214 + uVar24 * 4);
    fVar7 = *(float *)(&DAT_00166220 + uVar24 * 4);
    fVar8 = *(float *)(&DAT_0016622c + uVar24 * 4);
    fVar9 = *(float *)(&DAT_0016625c + uVar24 * 4);
    fVar10 = *(float *)(&DAT_00166214 + uVar24 * 4);
    fVar11 = *(float *)(&DAT_00166220 + uVar24 * 4);
    fVar12 = *(float *)(&DAT_0016622c + uVar24 * 4);
    fVar13 = *(float *)(&DAT_0016625c + uVar24 * 4);
    fVar14 = *(float *)(&DAT_00166238 + uVar24 * 4);
    fVar15 = *(float *)(&DAT_00166244 + uVar24 * 4);
    fVar16 = *(float *)(&DAT_00166250 + uVar24 * 4);
    fVar17 = *(float *)(&DAT_0016625c + uVar24 * 4);
    fVar18 = *(float *)(&DAT_00166268 + uVar24 * 4);
    fVar19 = *(float *)(&DAT_00166274 + uVar24 * 4);
    fVar20 = *(float *)(&DAT_00166280 + uVar24 * 4);
    fVar21 = *(float *)(&DAT_00166280 + uVar24 * 4);
    fVar22 = *(float *)(&DAT_0016628c + uVar24 * 4);
    pIVar23->Colors[0].x = *(float *)(&DAT_00166208 + uVar24 * 4);
    pIVar23->Colors[0].y = fVar1;
    pIVar23->Colors[0].z = fVar2;
    *(undefined8 *)&pIVar23->Colors[0].w = 0x3f19999a3f800000;
    pIVar23->Colors[1].y = 0.6;
    pIVar23->Colors[1].z = 0.6;
    pIVar23->Colors[1].w = 1.0;
    pIVar23->Colors[2].x = fVar3;
    pIVar23->Colors[2].y = fVar4;
    pIVar23->Colors[2].z = fVar5;
    pIVar23->Colors[2].w = 1.0;
    pIVar23->Colors[10].x = fVar6;
    pIVar23->Colors[10].y = fVar7;
    pIVar23->Colors[10].z = fVar8;
    pIVar23->Colors[10].w = fVar9;
    pIVar23->Colors[0xb].x = fVar10;
    pIVar23->Colors[0xb].y = fVar11;
    pIVar23->Colors[0xb].z = fVar12;
    pIVar23->Colors[0xb].w = fVar13;
    pIVar23->Colors[0xc].x = fVar14;
    pIVar23->Colors[0xc].y = fVar15;
    pIVar23->Colors[0xc].z = fVar16;
    pIVar23->Colors[0xc].w = fVar17;
    pIVar23->Colors[3].x = fVar18;
    pIVar23->Colors[3].y = fVar4;
    pIVar23->Colors[3].z = fVar19;
    pIVar23->Colors[3].w = 1.0;
    pIVar23->Colors[4].x = fVar20;
    pIVar23->Colors[4].y = fVar21;
    pIVar23->Colors[4].z = fVar22;
    pIVar23->Colors[4].w = 1.0;
    pIVar23->Colors[0x34].x = 0.0;
    pIVar23->Colors[0x34].y = 0.0;
    pIVar23->Colors[0x34].z = 0.0;
    pIVar23->Colors[0x34].w = 0.0;
  }
  return;
}

Assistant:

void changeColorScheme(bool inc = true) {
        if (inc) {
            colorScheme = (ColorScheme)(((int) colorScheme + 1) % ((int)ColorScheme::COUNT));
        }

        ImVec4* colors = ImGui::GetStyle().Colors;
        switch (colorScheme) {
            case ColorScheme::Default:
                {
                    colors[ImGuiCol_Text]                   = ImVec4(0.00f, 0.00f, 0.00f, 1.00f);
                    colors[ImGuiCol_TextDisabled]           = ImVec4(0.60f, 0.60f, 0.60f, 1.00f);
                    colors[ImGuiCol_WindowBg]               = ImVec4(0.96f, 0.96f, 0.94f, 1.00f);
                    colors[ImGuiCol_TitleBg]                = ImVec4(1.00f, 0.40f, 0.00f, 1.00f);
                    colors[ImGuiCol_TitleBgActive]          = ImVec4(1.00f, 0.40f, 0.00f, 1.00f);
                    colors[ImGuiCol_TitleBgCollapsed]       = ImVec4(0.69f, 0.25f, 0.00f, 1.00f);
                    colors[ImGuiCol_ChildBg]                = ImVec4(0.96f, 0.96f, 0.94f, 1.00f);
                    colors[ImGuiCol_PopupBg]                = ImVec4(0.96f, 0.96f, 0.94f, 1.00f);
                    colors[ImGuiCol_ModalWindowDimBg]       = ImVec4(0.00f, 0.00f, 0.00f, 0.00f);
                }
                break;
            case ColorScheme::Dark:
                {
                    colors[ImGuiCol_Text]                   = ImVec4(1.00f, 1.00f, 1.00f, 1.00f);
                    colors[ImGuiCol_TextDisabled]           = ImVec4(0.60f, 0.60f, 0.60f, 1.00f);
                    colors[ImGuiCol_WindowBg]               = ImVec4(0.10f, 0.10f, 0.10f, 1.00f);
                    colors[ImGuiCol_TitleBg]                = ImVec4(1.00f, 0.40f, 0.00f, 0.50f);
                    colors[ImGuiCol_TitleBgActive]          = ImVec4(1.00f, 0.40f, 0.00f, 0.50f);
                    colors[ImGuiCol_TitleBgCollapsed]       = ImVec4(0.69f, 0.25f, 0.00f, 0.50f);
                    colors[ImGuiCol_ChildBg]                = ImVec4(0.10f, 0.10f, 0.10f, 1.00f);
                    colors[ImGuiCol_PopupBg]                = ImVec4(0.20f, 0.20f, 0.20f, 1.00f);
                    colors[ImGuiCol_ModalWindowDimBg]       = ImVec4(0.00f, 0.00f, 0.00f, 0.00f);
                }
                break;
            case ColorScheme::Green:
                {
                    colors[ImGuiCol_Text]                   = ImVec4(0.00f, 1.00f, 0.00f, 1.00f);
                    colors[ImGuiCol_TextDisabled]           = ImVec4(0.60f, 0.60f, 0.60f, 1.00f);
                    colors[ImGuiCol_WindowBg]               = ImVec4(0.10f, 0.10f, 0.10f, 1.00f);
                    colors[ImGuiCol_TitleBg]                = ImVec4(0.25f, 0.25f, 0.25f, 1.00f);
                    colors[ImGuiCol_TitleBgActive]          = ImVec4(0.25f, 0.25f, 0.25f, 1.00f);
                    colors[ImGuiCol_TitleBgCollapsed]       = ImVec4(0.50f, 1.00f, 0.50f, 1.00f);
                    colors[ImGuiCol_ChildBg]                = ImVec4(0.10f, 0.10f, 0.10f, 1.00f);
                    colors[ImGuiCol_PopupBg]                = ImVec4(0.00f, 0.00f, 0.00f, 1.00f);
                    colors[ImGuiCol_ModalWindowDimBg]       = ImVec4(0.00f, 0.00f, 0.00f, 0.00f);
                }
                break;
            default:
                {
                }
        }
    }